

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_url_session.hpp
# Opt level: O2

void __thiscall
m2d::savanna::
async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>
::on_handshake(async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>
               *this,error_code ec)

{
  ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>
  *stream;
  __type_conflict1 _Var1;
  size_type local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_190 [2];
  undefined1 local_180 [32];
  system_error local_160;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_120;
  
  if ((ec._0_8_ >> 0x20 & 1) == 0) {
    async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
    ::current_scheme_abi_cxx11_((string *)local_180,this);
    _Var1 = std::operator==((string *)local_180,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            url_scheme::https_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_180);
    if (_Var1) {
      boost::beast::
      basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
      ::expires_after((basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
                       *)(((this->ssl_stream_).
                           super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->p_)._M_t.
                         super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                      ,(duration)(this->original_request_).timeout_interval.__r);
      stream = (this->ssl_stream_).
               super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::
      __shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>,(__gnu_cxx::_Lock_policy)2>
      ::
      __shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>,void>
                ((__shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>,(__gnu_cxx::_Lock_policy)2>
                  *)&local_198,
                 (__weak_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>,_(__gnu_cxx::_Lock_policy)2>
                  *)this);
      local_180._0_8_ = on_write;
      local_180._8_8_ = 0;
      local_180._16_8_ = local_198;
      local_180._24_8_ = a_Stack_190[0]._M_pi;
      local_198 = 0;
      a_Stack_190[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::beast::http::
      async_write<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>,boost::beast::detail::bind_front_wrapper<void(m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>::*)(boost::system::error_code,unsigned_long),std::shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>>>>
                (stream,&this->request_,
                 (bind_front_wrapper<void_(m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>_>_>
                  *)local_180,(type *)0x0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_190);
    }
  }
  else {
    boost::system::system_error::system_error(&local_160,ec);
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::result(&local_120,&local_160);
    std::
    function<void_(m2d::savanna::result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>)>
    ::operator()(&this->completion_,&local_120);
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::~result(&local_120);
    boost::system::system_error::~system_error(&local_160);
  }
  return;
}

Assistant:

void on_handshake(beast::error_code ec)
		{
			if (ec) {
				completion_(savanna::result<http::response<Body>>(beast::system_error { ec }));
				return;
			}
			if (current_scheme() == url_scheme::https) {
				// Set a timeout on the operation
				beast::get_lowest_layer(*ssl_stream_).expires_after(original_request_.timeout_interval);
				// Send the HTTP request to the remote host
				http::async_write(*ssl_stream_, request_, beast::bind_front_handler(&async_request_executor::on_write, this->shared_from_this()));
			}
		}